

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

void FT_Outline_Reverse(FT_Outline *outline)

{
  char cVar1;
  FT_Pos FVar2;
  FT_Pos FVar3;
  FT_Pos FVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  FT_Vector *pFVar10;
  char *pcVar11;
  FT_Vector *pFVar12;
  FT_Vector *pFVar13;
  FT_Vector swap;
  
  if (outline != (FT_Outline *)0x0) {
    if (0 < outline->n_contours) {
      uVar5 = 0;
      lVar7 = 0;
      do {
        lVar6 = (long)outline->contours[uVar5];
        if (lVar7 < lVar6) {
          pFVar10 = outline->points + lVar6;
          pFVar13 = outline->points + lVar7;
          do {
            pFVar12 = pFVar13 + 1;
            FVar2 = pFVar13->x;
            FVar3 = pFVar13->y;
            FVar4 = pFVar10->y;
            pFVar13->x = pFVar10->x;
            pFVar13->y = FVar4;
            pFVar10->x = FVar2;
            pFVar10->y = FVar3;
            pFVar10 = pFVar10 + -1;
            pFVar13 = pFVar12;
          } while (pFVar12 < pFVar10);
        }
        if (lVar7 < lVar6) {
          pcVar11 = outline->tags + lVar6;
          pcVar9 = outline->tags + lVar7;
          do {
            pcVar8 = pcVar9 + 1;
            cVar1 = *pcVar9;
            *pcVar9 = *pcVar11;
            *pcVar11 = cVar1;
            pcVar11 = pcVar11 + -1;
            pcVar9 = pcVar8;
          } while (pcVar8 < pcVar11);
        }
        lVar7 = lVar6 + 1;
        uVar5 = uVar5 + 1;
      } while ((short)uVar5 < outline->n_contours);
    }
    *(byte *)&outline->flags = (byte)outline->flags ^ 4;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Outline_Reverse( FT_Outline*  outline )
  {
    FT_UShort  n;
    FT_Int     first, last;


    if ( !outline )
      return;

    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      last  = outline->contours[n];

      /* reverse point table */
      {
        FT_Vector*  p = outline->points + first;
        FT_Vector*  q = outline->points + last;
        FT_Vector   swap;


        while ( p < q )
        {
          swap = *p;
          *p   = *q;
          *q   = swap;
          p++;
          q--;
        }
      }

      /* reverse tags table */
      {
        char*  p = outline->tags + first;
        char*  q = outline->tags + last;


        while ( p < q )
        {
          char  swap;


          swap = *p;
          *p   = *q;
          *q   = swap;
          p++;
          q--;
        }
      }

      first = last + 1;
    }

    outline->flags ^= FT_OUTLINE_REVERSE_FILL;
  }